

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

metric_name __thiscall fasttext::Args::getAutotuneMetric(Args *this)

{
  metric_name mVar1;
  bool bVar2;
  runtime_error *this_00;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  __lhs = &this->autotuneMetric;
  std::__cxx11::string::substr((ulong)&bStack_38,(ulong)__lhs);
  bVar2 = std::operator==(&bStack_38,"f1:");
  std::__cxx11::string::~string((string *)&bStack_38);
  if (bVar2) {
    mVar1 = labelf1score;
  }
  else {
    bVar2 = std::operator==(__lhs,"f1");
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_38,"Unknown metric : ",__lhs);
      std::runtime_error::runtime_error(this_00,(string *)&bStack_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    mVar1 = f1score;
  }
  return mVar1;
}

Assistant:

metric_name Args::getAutotuneMetric() const {
  if (autotuneMetric.substr(0, 3) == "f1:") {
    return metric_name::labelf1score;
  } else if (autotuneMetric == "f1") {
    return metric_name::f1score;
  }
  throw std::runtime_error("Unknown metric : " + autotuneMetric);
}